

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O1

shared_ptr<const_libtorrent::torrent_info> __thiscall
libtorrent::torrent_handle::torrent_file(torrent_handle *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<const_libtorrent::torrent_info> *in_RSI;
  shared_ptr<const_libtorrent::torrent_info> sVar2;
  undefined8 local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_18 = 0;
  p_Stack_10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar2 = sync_call_ret<std::shared_ptr<libtorrent::torrent_info_const>,std::shared_ptr<libtorrent::torrent_info_const>(libtorrent::aux::torrent::*)()const>
                    (this,in_RSI,(offset_in_torrent_to_subr)&local_18);
  _Var1 = sVar2.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (p_Stack_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_libtorrent::torrent_info>)
         sVar2.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const torrent_info> torrent_handle::torrent_file() const
	{
		return sync_call_ret<std::shared_ptr<const torrent_info>>(
			std::shared_ptr<const torrent_info>(), &aux::torrent::get_torrent_file);
	}